

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gmock-matchers.h
# Opt level: O1

PolymorphicMatcher<testing::internal::HasSubstrMatcher<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
* testing::HasSubstr<char[38]>
            (PolymorphicMatcher<testing::internal::HasSubstrMatcher<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *__return_storage_ptr__,StringLike<char[38]> *substring)

{
  size_t sVar1;
  long *local_60;
  long local_58;
  long local_50 [2];
  long *local_40;
  long local_38;
  long local_30 [2];
  
  local_40 = local_30;
  sVar1 = strlen(*substring);
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_40,substring,*substring + sVar1);
  local_60 = local_50;
  std::__cxx11::string::_M_construct<char*>((string *)&local_60,local_40,local_38 + (long)local_40);
  (__return_storage_ptr__->impl_).substring_._M_dataplus._M_p =
       (pointer)&(__return_storage_ptr__->impl_).substring_.field_2;
  std::__cxx11::string::_M_construct<char*>
            ((string *)__return_storage_ptr__,local_60,local_58 + (long)local_60);
  if (local_60 != local_50) {
    operator_delete(local_60,local_50[0] + 1);
  }
  if (local_40 != local_30) {
    operator_delete(local_40,local_30[0] + 1);
  }
  return __return_storage_ptr__;
}

Assistant:

PolymorphicMatcher<internal::HasSubstrMatcher<std::string>> HasSubstr(
    const internal::StringLike<T>& substring) {
  return MakePolymorphicMatcher(
      internal::HasSubstrMatcher<std::string>(std::string(substring)));
}